

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ralocal.cpp
# Opt level: O2

Error __thiscall
asmjit::v1_14::RALocalAllocator::spillAfterAllocation(RALocalAllocator *this,InstNode *node)

{
  uint32_t uVar1;
  uint workId;
  RAInst *this_00;
  RegGroup RVar2;
  uint32_t physId;
  Error EVar3;
  RATiedReg *pRVar4;
  RAWorkReg **ppRVar5;
  uint32_t i;
  uint32_t index;
  
  this_00 = *(RAInst **)(node + 0x20);
  uVar1 = this_00->_tiedTotal;
  index = 0;
  do {
    if (uVar1 == index) {
      return 0;
    }
    pRVar4 = RAInst::tiedAt(this_00,index);
    if ((pRVar4->_flags & kLast) != kNone) {
      workId = pRVar4->_workId;
      ppRVar5 = ZoneVector<asmjit::v1_14::RAWorkReg_*>::operator[]
                          (&this->_pass->_workRegs,(ulong)workId);
      if ((*ppRVar5)[0x4a] == (RAWorkReg)0xff) {
        RVar2 = (RegGroup)((uint)*(undefined4 *)(*ppRVar5 + 0x20) >> 8);
        physId = RAAssignment::workToPhysId(&this->_curAssignment,RVar2 & kMaxValue,workId);
        if (physId != 0xff) {
          (this->_cc->super_BaseBuilder)._cursor = (BaseNode *)node;
          EVar3 = onSpillReg(this,RVar2 & kMaxValue,workId,physId);
          if (EVar3 != 0) {
            return EVar3;
          }
        }
      }
    }
    index = index + 1;
  } while( true );
}

Assistant:

Error RALocalAllocator::spillAfterAllocation(InstNode* node) noexcept {
  // This is experimental feature that would spill registers that don't have home-id and are last in this basic block.
  // This prevents saving these regs in other basic blocks and then restoring them (mostly relevant for loops).
  RAInst* raInst = node->passData<RAInst>();
  uint32_t count = raInst->tiedCount();

  for (uint32_t i = 0; i < count; i++) {
    RATiedReg* tiedReg = raInst->tiedAt(i);
    if (tiedReg->isLast()) {
      uint32_t workId = tiedReg->workId();
      RAWorkReg* workReg = workRegById(workId);
      if (!workReg->hasHomeRegId()) {
        RegGroup group = workReg->group();
        uint32_t assignedId = _curAssignment.workToPhysId(group, workId);
        if (assignedId != RAAssignment::kPhysNone) {
          _cc->_setCursor(node);
          ASMJIT_PROPAGATE(onSpillReg(group, workId, assignedId));
        }
      }
    }
  }

  return kErrorOk;
}